

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetSourcesCommand.cxx
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cmTargetSourcesCommand::ConvertToAbsoluteContent
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,cmTargetSourcesCommand *this,cmTarget *tgt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content,bool isInterfaceContent)

{
  pointer pbVar1;
  size_t __n;
  cmMakefile *pcVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  bool bVar4;
  PolicyStatus PVar5;
  int iVar6;
  size_type sVar7;
  string *psVar8;
  string *psVar9;
  ostream *poVar10;
  PolicyID id;
  long lVar11;
  pointer in_name;
  char *pcVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  bool bVar13;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  absoluteContent;
  ostringstream e;
  string local_200;
  cmTarget *local_1e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_1e0 = tgt;
  PVar5 = cmMakefile::GetPolicyStatus
                    ((this->super_cmTargetPropCommandBase).super_cmCommand.Makefile,CMP0076,false);
  if (PVar5 == OLD) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(__return_storage_ptr__,content);
    return __return_storage_ptr__;
  }
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&local_1c8,
            (long)(content->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(content->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 5);
  in_name = (content->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (content->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (in_name != pbVar1) {
    bVar13 = false;
    local_1d8 = content;
    local_1d0 = __return_storage_ptr__;
    do {
      local_1a8._8_8_ = 0;
      local_1a8[0x10] = '\0';
      local_1a8._0_8_ = local_1a8 + 0x10;
      bVar4 = cmsys::SystemTools::FileIsFullPath(in_name);
      if ((bVar4) || (sVar7 = cmGeneratorExpression::Find(in_name), sVar7 == 0)) {
LAB_0022bc4b:
        std::__cxx11::string::_M_assign((string *)local_1a8);
      }
      else {
        if (!isInterfaceContent) {
          psVar8 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_
                             ((this->super_cmTargetPropCommandBase).super_cmCommand.Makefile);
          psVar9 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(local_1e0->Makefile);
          __n = psVar8->_M_string_length;
          if ((__n == psVar9->_M_string_length) &&
             ((__n == 0 ||
              (iVar6 = bcmp((psVar8->_M_dataplus)._M_p,(psVar9->_M_dataplus)._M_p,__n), iVar6 == 0))
             )) goto LAB_0022bc4b;
        }
        cmMakefile::GetCurrentSourceDirectory_abi_cxx11_
                  ((this->super_cmTargetPropCommandBase).super_cmCommand.Makefile);
        std::__cxx11::string::_M_assign((string *)local_1a8);
        std::__cxx11::string::append((char *)local_1a8);
        bVar13 = true;
        std::__cxx11::string::_M_append((char *)local_1a8,(ulong)(in_name->_M_dataplus)._M_p);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_1c8,(value_type *)local_1a8);
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
      }
      __return_storage_ptr__ = local_1d0;
      pvVar3 = local_1d8;
      in_name = in_name + 1;
    } while (in_name != pbVar1);
    content = local_1d8;
    if (bVar13) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      PVar5 = cmMakefile::GetPolicyStatus
                        ((this->super_cmTargetPropCommandBase).super_cmCommand.Makefile,CMP0076,
                         false);
      __x = &local_1c8;
      switch(PVar5) {
      case OLD:
switchD_0022bcd7_caseD_0:
        __x = pvVar3;
      case NEW:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(__return_storage_ptr__,__x);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        goto LAB_0022be42;
      case WARN:
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_200,(cmPolicies *)0x4c,id);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,local_200._M_dataplus._M_p,
                             local_200._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
        break;
      case REQUIRED_IF_USED:
      case REQUIRED_ALWAYS:
        pcVar2 = (this->super_cmTargetPropCommandBase).super_cmCommand.Makefile;
        cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_200,(cmPolicies *)0x4c,id);
        cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_200);
        break;
      default:
        goto switchD_0022bcd7_default;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
      }
switchD_0022bcd7_default:
      pcVar12 = "A private source from a directory other than that of target \"";
      if (isInterfaceContent) {
        pcVar12 = "An interface source of target \"";
      }
      lVar11 = 0x3d;
      if (isInterfaceContent) {
        lVar11 = 0x1f;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar12,lVar11);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,(local_1e0->Name)._M_dataplus._M_p,
                           (local_1e0->Name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" has a relative path.",0x16);
      pcVar2 = (this->super_cmTargetPropCommandBase).super_cmCommand.Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar2,AUTHOR_WARNING,&local_200);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
      }
      goto switchD_0022bcd7_caseD_0;
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__,content);
LAB_0022be42:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c8);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> cmTargetSourcesCommand::ConvertToAbsoluteContent(
  cmTarget* tgt, const std::vector<std::string>& content,
  bool isInterfaceContent)
{
  // Skip conversion in case old behavior has been explicitly requested
  if (this->Makefile->GetPolicyStatus(cmPolicies::CMP0076) ==
      cmPolicies::OLD) {
    return content;
  }

  bool changedPath = false;
  std::vector<std::string> absoluteContent;
  absoluteContent.reserve(content.size());
  for (std::string const& src : content) {
    std::string absoluteSrc;
    if (cmSystemTools::FileIsFullPath(src) ||
        cmGeneratorExpression::Find(src) == 0 ||
        (!isInterfaceContent &&
         (this->Makefile->GetCurrentSourceDirectory() ==
          tgt->GetMakefile()->GetCurrentSourceDirectory()))) {
      absoluteSrc = src;
    } else {
      changedPath = true;
      absoluteSrc = this->Makefile->GetCurrentSourceDirectory();
      absoluteSrc += "/";
      absoluteSrc += src;
    }
    absoluteContent.push_back(absoluteSrc);
  }

  if (!changedPath) {
    return content;
  }

  bool issueMessage = true;
  bool useAbsoluteContent = false;
  std::ostringstream e;
  switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0076)) {
    case cmPolicies::WARN:
      e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0076) << "\n";
      break;
    case cmPolicies::OLD:
      issueMessage = false;
      break;
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::REQUIRED_IF_USED:
      this->Makefile->IssueMessage(
        MessageType::FATAL_ERROR,
        cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0076));
      break;
    case cmPolicies::NEW: {
      issueMessage = false;
      useAbsoluteContent = true;
      break;
    }
  }

  if (issueMessage) {
    if (isInterfaceContent) {
      e << "An interface source of target \"" << tgt->GetName()
        << "\" has a relative path.";
    } else {
      e << "A private source from a directory other than that of target \""
        << tgt->GetName() << "\" has a relative path.";
    }
    this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, e.str());
  }

  return useAbsoluteContent ? absoluteContent : content;
}